

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::get_type_address_space_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type,uint32_t id,bool argument
          )

{
  StorageClass SVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  ExecutionModel EVar5;
  int iVar6;
  SPIRVariable *var;
  Bitset *pBVar7;
  undefined4 in_register_0000000c;
  char **ppcVar8;
  uint *puVar9;
  undefined7 uVar10;
  char *pcVar11;
  char *__s1;
  bool bVar12;
  allocator local_b9;
  uint32_t local_b8;
  uint32_t local_b4;
  char *addr_space;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_a8;
  Bitset flags;
  
  ppcVar8 = (char **)CONCAT44(in_register_0000000c,id);
  flags.lower = 0;
  flags.higher._M_h._M_buckets = &flags.higher._M_h._M_single_bucket;
  flags.higher._M_h._M_bucket_count = 1;
  flags.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  flags.higher._M_h._M_element_count = 0;
  flags.higher._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  flags.higher._M_h._M_rehash_policy._M_next_resize = 0;
  flags.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
  var = Compiler::maybe_get<spirv_cross::SPIRVariable>((Compiler *)this,id);
  if (((var == (SPIRVariable *)0x0) || (type->basetype != Struct)) ||
     ((bVar2 = Compiler::has_decoration((Compiler *)this,(ID)(type->super_IVariant).self.id,Block),
      !bVar2 && (bVar2 = Compiler::has_decoration
                                   ((Compiler *)this,(ID)(type->super_IVariant).self.id,BufferBlock)
                , !bVar2)))) {
    pBVar7 = Compiler::get_decoration_bitset((Compiler *)this,(ID)id);
    Bitset::operator=(&flags,pBVar7);
  }
  else {
    Compiler::get_buffer_block_flags((Bitset *)&addr_space,(Compiler *)this,(VariableID)id);
    Bitset::operator=(&flags,(Bitset *)&addr_space);
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_a8);
  }
  addr_space = (char *)0x0;
  SVar1 = type->storage;
  puVar9 = &switchD_001ff376::switchdataD_0033386c;
  switch(SVar1) {
  case StorageClassUniformConstant:
  case StorageClassUniform:
  case PushConstant:
    if (type->basetype == Struct) {
      bVar2 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(type->super_IVariant).self.id,BufferBlock);
      puVar9 = (uint *)0x337ca8;
      pcVar11 = "const device";
      if (((uint)flags.lower >> 0x18 & 1) == 0) {
        pcVar11 = "device";
      }
      __s1 = "constant";
      addr_space = "constant";
      if (bVar2) {
        __s1 = pcVar11;
        addr_space = pcVar11;
      }
      goto LAB_001ff644;
    }
    if (!argument) {
      __s1 = "constant";
      addr_space = "constant";
      goto LAB_001ff644;
    }
    if (((type->basetype == Image) && ((type->image).dim == DimSubpassData)) &&
       ((this->msl_options).use_framebuffer_fetch_subpasses == true)) {
      __s1 = "";
      addr_space = "";
      goto LAB_001ff644;
    }
    break;
  case Input:
    bVar2 = is_tesc_shader(this);
    uVar10 = (undefined7)((ulong)puVar9 >> 8);
    if ((bVar2 && var != (SPIRVariable *)0x0) &&
       ((var->basevariable).id == (this->stage_in_ptr_var_id).id)) {
      __s1 = "threadgroup";
      addr_space = __s1;
      if ((this->msl_options).multi_patch_workgroup != false) {
        __s1 = "const device";
        addr_space = __s1;
      }
    }
    else {
      __s1 = (char *)0x0;
    }
    bVar2 = is_tese_shader(this);
    puVar9 = (uint *)CONCAT71(uVar10,var != (SPIRVariable *)0x0);
    if (((bVar2 && var != (SPIRVariable *)0x0) & (this->msl_options).raw_buffer_tese_input) == 1) {
      local_b4 = (var->basevariable).id;
      local_b8 = (this->stage_in_ptr_var_id).id;
      bVar2 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationPatch);
      bVar3 = Compiler::has_decoration((Compiler *)this,(ID)(var->super_IVariant).self.id,BuiltIn);
      uVar4 = Compiler::get_decoration((Compiler *)this,(ID)(var->super_IVariant).self.id,BuiltIn);
      bVar12 = uVar4 - 0xb < 2;
      puVar9 = (uint *)(ulong)local_b8;
      if ((local_b4 == local_b8) ||
         (puVar9 = (uint *)(ulong)CONCAT31((int3)(local_b8 >> 8),bVar3 && bVar12),
         bVar2 && (!bVar3 || !bVar12))) {
        __s1 = "const device";
        addr_space = "const device";
      }
    }
    EVar5 = Compiler::get_execution_model((Compiler *)this);
    if (((var != (SPIRVariable *)0x0) && (EVar5 == ExecutionModelFragment)) &&
       ((var->basevariable).id == (this->stage_in_var_id).id)) {
      __s1 = "thread";
      addr_space = "thread";
      goto LAB_001ff644;
    }
    goto LAB_001ff60f;
  case Output:
    if (this->capture_output_to_buffer == true) {
      if (var == (SPIRVariable *)0x0) {
LAB_001ff5ee:
        addr_space = "device";
      }
      else {
        bVar2 = CompilerGLSL::is_stage_output_variable_masked(&this->super_CompilerGLSL,var);
        if (bVar2) {
          bVar2 = Compiler::is_tessellation_shader((Compiler *)this);
          if (!bVar2) {
            addr_space = "thread";
            goto LAB_001ff5fa;
          }
        }
        else {
          iVar6 = (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1c])(this,var,4);
          if ((char)iVar6 == '\0') goto LAB_001ff5ee;
        }
        addr_space = "threadgroup";
      }
    }
LAB_001ff5fa:
    __s1 = addr_space;
    bVar2 = is_mesh_shader(this);
    if (bVar2) goto switchD_001ff376_caseD_4;
LAB_001ff60f:
    if (__s1 != (char *)0x0) goto LAB_001ff644;
    break;
  case StorageClassWorkgroup:
switchD_001ff376_caseD_4:
    __s1 = "threadgroup";
    addr_space = "threadgroup";
    goto LAB_001ff644;
  case CrossWorkgroup:
  case Private:
  case Function:
  case Generic:
  case AtomicCounter:
  case Image:
    break;
  case StorageBuffer:
switchD_001ff376_caseD_c:
    if ((var == (SPIRVariable *)0x0) ||
       (bVar2 = Compiler::has_decoration((Compiler *)this,(ID)(type->super_IVariant).self.id,Block),
       bVar2)) {
      __s1 = "const device";
      addr_space = "const device";
      if ((flags.lower & 0x1000000) == 0) {
        __s1 = "device";
        addr_space = "device";
      }
    }
    else {
      __s1 = "device";
      addr_space = "device";
    }
    goto LAB_001ff644;
  default:
    puVar9 = (uint *)ppcVar8;
    if (SVar1 == PhysicalStorageBuffer) goto switchD_001ff376_caseD_c;
    if (SVar1 == StorageClassTaskPayloadWorkgroupEXT) {
      bVar2 = is_mesh_shader(this);
      puVar9 = (uint *)ppcVar8;
      if (bVar2) {
        __s1 = "const object_data";
        addr_space = "const object_data";
      }
      else {
        __s1 = "object_data";
        addr_space = "object_data";
      }
      goto LAB_001ff644;
    }
  }
  puVar9 = (uint *)0x2fba29;
  __s1 = "";
  if (type->basetype == ControlPointArray) {
    __s1 = "thread";
  }
  if (!argument) {
    __s1 = "";
  }
  addr_space = __s1;
  if (type->pointer != false) {
    __s1 = "thread";
    addr_space = "thread";
  }
LAB_001ff644:
  if (((flags.lower & 0xa00000) == 0) || (iVar6 = strcmp(__s1,"thread"), iVar6 == 0)) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,__s1,&local_b9);
  }
  else {
    join<char_const(&)[10],char_const*&>
              (__return_storage_ptr__,(spirv_cross *)"volatile ",(char (*) [10])&addr_space,
               (char **)puVar9);
  }
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&flags.higher._M_h);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::get_type_address_space(const SPIRType &type, uint32_t id, bool argument)
{
	// This can be called for variable pointer contexts as well, so be very careful about which method we choose.
	Bitset flags;
	auto *var = maybe_get<SPIRVariable>(id);
	if (var && type.basetype == SPIRType::Struct &&
	    (has_decoration(type.self, DecorationBlock) || has_decoration(type.self, DecorationBufferBlock)))
		flags = get_buffer_block_flags(id);
	else
		flags = get_decoration_bitset(id);

	const char *addr_space = nullptr;
	switch (type.storage)
	{
	case StorageClassWorkgroup:
		addr_space = "threadgroup";
		break;

	case StorageClassStorageBuffer:
	case StorageClassPhysicalStorageBuffer:
	{
		// For arguments from variable pointers, we use the write count deduction, so
		// we should not assume any constness here. Only for global SSBOs.
		bool readonly = false;
		if (!var || has_decoration(type.self, DecorationBlock))
			readonly = flags.get(DecorationNonWritable);

		addr_space = readonly ? "const device" : "device";
		break;
	}

	case StorageClassUniform:
	case StorageClassUniformConstant:
	case StorageClassPushConstant:
		if (type.basetype == SPIRType::Struct)
		{
			bool ssbo = has_decoration(type.self, DecorationBufferBlock);
			if (ssbo)
				addr_space = flags.get(DecorationNonWritable) ? "const device" : "device";
			else
				addr_space = "constant";
		}
		else if (!argument)
		{
			addr_space = "constant";
		}
		else if (type_is_msl_framebuffer_fetch(type))
		{
			// Subpass inputs are passed around by value.
			addr_space = "";
		}
		break;

	case StorageClassFunction:
	case StorageClassGeneric:
		break;

	case StorageClassInput:
		if (is_tesc_shader() && var && var->basevariable == stage_in_ptr_var_id)
			addr_space = msl_options.multi_patch_workgroup ? "const device" : "threadgroup";
		// Don't pass tessellation levels in the device AS; we load and convert them
		// to float manually.
		if (is_tese_shader() && msl_options.raw_buffer_tese_input && var)
		{
			bool is_stage_in = var->basevariable == stage_in_ptr_var_id;
			bool is_patch_stage_in = has_decoration(var->self, DecorationPatch);
			bool is_builtin = has_decoration(var->self, DecorationBuiltIn);
			BuiltIn builtin = (BuiltIn)get_decoration(var->self, DecorationBuiltIn);
			bool is_tess_level = is_builtin && (builtin == BuiltInTessLevelOuter || builtin == BuiltInTessLevelInner);
			if (is_stage_in || (is_patch_stage_in && !is_tess_level))
				addr_space = "const device";
		}
		if (get_execution_model() == ExecutionModelFragment && var && var->basevariable == stage_in_var_id)
			addr_space = "thread";
		break;

	case StorageClassOutput:
		if (capture_output_to_buffer)
		{
			if (var && type.storage == StorageClassOutput)
			{
				bool is_masked = is_stage_output_variable_masked(*var);

				if (is_masked)
				{
					if (is_tessellation_shader())
						addr_space = "threadgroup";
					else
						addr_space = "thread";
				}
				else if (variable_decl_is_remapped_storage(*var, StorageClassWorkgroup))
					addr_space = "threadgroup";
			}

			if (!addr_space)
				addr_space = "device";
		}

		if (is_mesh_shader())
			addr_space = "threadgroup";
		break;

	case StorageClassTaskPayloadWorkgroupEXT:
		if (is_mesh_shader())
			addr_space = "const object_data";
		else
			addr_space = "object_data";
		break;

	default:
		break;
	}

	if (!addr_space)
	{
		// No address space for plain values.
		addr_space = type.pointer || (argument && type.basetype == SPIRType::ControlPointArray) ? "thread" : "";
	}

	if (decoration_flags_signal_volatile(flags) && 0 != strcmp(addr_space, "thread"))
		return join("volatile ", addr_space);
	else
		return addr_space;
}